

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O1

int nghttp2_http_on_response_headers(nghttp2_stream *stream)

{
  short sVar1;
  uint uVar2;
  
  uVar2 = stream->http_flags;
  if ((uVar2 & 0x20) == 0) {
    return -1;
  }
  sVar1 = stream->status_code;
  if ((ushort)(sVar1 - 100U) < 100) {
    stream->http_flags = uVar2 & 0x780 | 0x4000;
    stream->content_length = -1;
    stream->status_code = -1;
  }
  else {
    stream->http_flags = uVar2 & 0xffffbfff;
    if (((((uVar2 >> 8 & 1) == 0) && (99 < (int)sVar1 - 100U)) && (sVar1 != 0x130)) &&
       (sVar1 != 0xcc)) {
      if ((uVar2 & 0x480) == 0) {
        return 0;
      }
      stream->content_length = -1;
      return 0;
    }
    stream->content_length = 0;
  }
  return 0;
}

Assistant:

int nghttp2_http_on_response_headers(nghttp2_stream *stream) {
  if ((stream->http_flags & NGHTTP2_HTTP_FLAG__STATUS) == 0) {
    return -1;
  }

  if (stream->status_code / 100 == 1) {
    /* non-final response */
    stream->http_flags = (stream->http_flags & NGHTTP2_HTTP_FLAG_METH_ALL) |
                         NGHTTP2_HTTP_FLAG_EXPECT_FINAL_RESPONSE;
    stream->content_length = -1;
    stream->status_code = -1;
    return 0;
  }

  stream->http_flags =
      stream->http_flags & (uint32_t)~NGHTTP2_HTTP_FLAG_EXPECT_FINAL_RESPONSE;

  if (!expect_response_body(stream)) {
    stream->content_length = 0;
  } else if (stream->http_flags & (NGHTTP2_HTTP_FLAG_METH_CONNECT |
                                   NGHTTP2_HTTP_FLAG_METH_UPGRADE_WORKAROUND)) {
    stream->content_length = -1;
  }

  return 0;
}